

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_resize_filter_arena(Parser *this,size_t num_characters)

{
  ulong uVar1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  char *pcVar5;
  char msg [39];
  char local_48 [48];
  
  uVar1 = (this->m_filter_arena).len;
  if (uVar1 < num_characters) {
    pcVar5 = (this->m_filter_arena).str;
    if (pcVar5 != (char *)0x0) {
      if (uVar1 == 0) {
        builtin_strncpy(local_48,"check failed: (m_filter_arena.len > 0)",0x27);
        if ((s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
        }
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f77) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f77) << 0x40,8);
        LVar3.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar3.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_48,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
      }
      (*(this->m_stack).m_callbacks.m_free)
                ((this->m_filter_arena).str,(this->m_filter_arena).len,
                 (this->m_stack).m_callbacks.m_user_data);
      (this->m_filter_arena).str = (char *)0x0;
    }
    pcVar5 = (char *)(*(this->m_stack).m_callbacks.m_allocate)
                               (num_characters,pcVar5,(this->m_stack).m_callbacks.m_user_data);
    (this->m_filter_arena).str = pcVar5;
    (this->m_filter_arena).len = num_characters;
  }
  return;
}

Assistant:

void Parser::_resize_filter_arena(size_t num_characters)
{
    if(num_characters > m_filter_arena.len)
    {
        _c4dbgpf("resize: sz={}", num_characters);
        char *prev = m_filter_arena.str;
        if(m_filter_arena.str)
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_filter_arena.len > 0);
            _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        }
        m_filter_arena.str = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, char, num_characters, prev);
        m_filter_arena.len = num_characters;
    }
}